

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase1958::run(TestCase1958 *this)

{
  bool bVar1;
  bool local_179;
  int local_178;
  bool _kj_shouldLog;
  SourceLocation local_170;
  WeirdAlign local_158;
  DebugExpression<int> local_13c;
  undefined1 local_138 [8];
  DebugComparison<int,_int> _kjCondition;
  Promise<void> local_f0;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:1973:20),_void>
  p2;
  WeirdAlign value2;
  WeirdAlign value;
  undefined1 local_c0 [8];
  Promise<void> p;
  undefined1 local_a8 [8];
  WaitScope waitScope;
  EventLoop loop;
  TestCase1958 *this_local;
  
  EventLoop::EventLoop((EventLoop *)&waitScope.runningStacksPool);
  WaitScope::WaitScope((WaitScope *)local_a8,(EventLoop *)&waitScope.runningStacksPool);
  kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)local_c0);
  value2._8_4_ = 0x7b;
  p2.super_PromiseBase.node.ptr._0_4_ = 0x1c8;
  _kjCondition.result = true;
  _kjCondition._25_3_ = 0;
  Promise<void>::then<kj::(anonymous_namespace)::TestCase1958::run()::__0>
            (&local_f0,(Type *)local_c0);
  (anonymous_namespace)::TestCase1958::run()::$_0::~__0((__0 *)&_kjCondition.result);
  SourceLocation::SourceLocation
            (&local_170,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
             ,"run",0x7b9,0x28);
  Promise<WeirdAlign>::wait((Promise<WeirdAlign> *)&local_158,&local_f0);
  local_13c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_158.i);
  local_178 = 0x243;
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_int> *)local_138,&local_13c,&local_178);
  run::WeirdAlign::~WeirdAlign(&local_158);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_138);
  if (!bVar1) {
    local_179 = kj::_::Debug::shouldLog(ERROR);
    while (local_179 != false) {
      kj::_::Debug::log<char_const(&)[45],kj::_::DebugComparison<int,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x7b9,ERROR,"\"failed: expected \" \"p2.wait(waitScope).i == 579\", _kjCondition",
                 (char (*) [45])"failed: expected p2.wait(waitScope).i == 579",
                 (DebugComparison<int,_int> *)local_138);
      local_179 = false;
    }
  }
  Promise<WeirdAlign>::~Promise((Promise<WeirdAlign> *)&local_f0);
  run::WeirdAlign::~WeirdAlign((WeirdAlign *)&p2);
  run::WeirdAlign::~WeirdAlign((WeirdAlign *)&value2.field_0x8);
  Promise<void>::~Promise((Promise<void> *)local_c0);
  WaitScope::~WaitScope((WaitScope *)local_a8);
  EventLoop::~EventLoop((EventLoop *)&waitScope.runningStacksPool);
  return;
}

Assistant:

~WeirdAlign() {
      KJ_EXPECT(reinterpret_cast<uintptr_t>(this) % 16 == 0);
    }